

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  undefined4 local_2c;
  float *outerLevels_local;
  float *innerLevels_local;
  bool usePointMode_local;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  
  if (usePointMode) {
    local_2c = referencePointModePrimitiveCount(primitiveType,spacingMode,innerLevels,outerLevels);
  }
  else {
    local_2c = referenceNonPointModePrimitiveCount
                         (primitiveType,spacingMode,innerLevels,outerLevels);
  }
  return local_2c;
}

Assistant:

int referencePrimitiveCount (const TessPrimitiveType primitiveType, const SpacingMode spacingMode, const bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}